

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabox.hpp
# Opt level: O0

AABox * operator+(AABox *__return_storage_ptr__,AABox *a,AABox *b)

{
  double dVar1;
  AABox *t;
  AABox *b_local;
  AABox *a_local;
  
  AABox::AABox(__return_storage_ptr__);
  dVar1 = std::fmin((double)(ulong)(uint)a->x1,(double)(ulong)(uint)b->x1);
  __return_storage_ptr__->x1 = SUB84(dVar1,0);
  dVar1 = std::fmax((double)(ulong)(uint)a->x2,(double)(ulong)(uint)b->x2);
  __return_storage_ptr__->x2 = SUB84(dVar1,0);
  dVar1 = std::fmin((double)(ulong)(uint)a->y1,(double)(ulong)(uint)b->y1);
  __return_storage_ptr__->y1 = SUB84(dVar1,0);
  dVar1 = std::fmax((double)(ulong)(uint)a->y2,(double)(ulong)(uint)b->y2);
  __return_storage_ptr__->y2 = SUB84(dVar1,0);
  dVar1 = std::fmin((double)(ulong)(uint)a->z1,(double)(ulong)(uint)b->z1);
  __return_storage_ptr__->z1 = SUB84(dVar1,0);
  dVar1 = std::fmax((double)(ulong)(uint)a->z2,(double)(ulong)(uint)b->z2);
  __return_storage_ptr__->z2 = SUB84(dVar1,0);
  return __return_storage_ptr__;
}

Assistant:

AABox operator+ (const AABox& a, const AABox& b) {
	AABox t;
	t.x1 = fmin(a.x1, b.x1);
	t.x2 = fmax(a.x2, b.x2);
	t.y1 = fmin(a.y1, b.y1);
	t.y2 = fmax(a.y2, b.y2);
	t.z1 = fmin(a.z1, b.z1);
	t.z2 = fmax(a.z2, b.z2);
	return t;
}